

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3raster.cpp
# Opt level: O3

bool32 rw::gl3::rasterFromImage(Raster *raster,Image *image)

{
  uint8 *puVar1;
  uint uVar2;
  bool32 bVar3;
  int iVar4;
  int32 depth;
  uint uVar5;
  int iVar6;
  int iVar7;
  long lVar8;
  int iVar9;
  uint8 *puVar10;
  uint8 *puVar11;
  uint8 *puVar12;
  uint8 *puVar13;
  code *pcVar14;
  Image *local_50;
  
  if ((raster->type & 0xfU) != 4) {
    return 0;
  }
  depth = image->depth;
  if (depth < 9) {
    local_50 = Image::create(image->width,image->height,depth);
    local_50->stride = image->stride;
    puVar1 = image->palette;
    local_50->pixels = image->pixels;
    local_50->palette = puVar1;
    Image::unpalettize(local_50,false);
    depth = local_50->depth;
    image = local_50;
  }
  else {
    local_50 = (Image *)0x0;
  }
  lVar8 = (long)nativeRasterOffset;
  uVar2 = raster->format & 0xf00;
  uVar5 = depth << 0x1e | depth - 4U >> 2;
  if (uVar5 == 3) {
    if (gl3Caps == 0) {
      if (uVar2 != 0x100) goto LAB_00119172;
      pcVar14 = conv_RGBA5551_from_ARGB1555;
    }
    else {
      pcVar14 = conv_RGBA8888_from_ARGB1555;
    }
  }
  else {
    if (uVar5 == 5) {
      pcVar14 = conv_RGBA8888_from_RGB888;
    }
    else {
      if (uVar5 != 7) goto LAB_00119172;
      pcVar14 = conv_RGBA8888_from_RGBA8888;
    }
    if ((gl3Caps == 0) && (uVar2 != 0x500)) {
      if (uVar2 != 0x600) {
LAB_00119172:
        rasterFromImage();
        return 0;
      }
      pcVar14 = conv_RGB888_from_RGB888;
    }
  }
  bVar3 = Image::hasAlpha(image);
  *(bool *)((long)&raster->width + lVar8 + 1) = bVar3 != 0;
  puVar1 = raster->pixels;
  if (puVar1 == (uint8 *)0x0) {
    Raster::lock(raster,0,5);
  }
  iVar7 = image->height;
  if (0 < iVar7) {
    iVar4 = image->width;
    iVar6 = image->stride;
    puVar12 = image->pixels + (iVar7 + -1) * iVar6;
    puVar11 = raster->pixels;
    iVar9 = 0;
    do {
      if (0 < iVar4) {
        iVar7 = 0;
        puVar10 = puVar11;
        puVar13 = puVar12;
        do {
          (*pcVar14)(puVar10,puVar13);
          puVar13 = puVar13 + image->bpp;
          puVar10 = puVar10 + *(int *)((long)&raster->privateFlags + lVar8);
          iVar7 = iVar7 + 1;
          iVar4 = image->width;
        } while (iVar7 < iVar4);
        iVar7 = image->height;
        iVar6 = image->stride;
      }
      puVar12 = puVar12 + -(long)iVar6;
      puVar11 = puVar11 + raster->stride;
      iVar9 = iVar9 + 1;
    } while (iVar9 < iVar7);
  }
  if (puVar1 == (uint8 *)0x0) {
    Raster::unlock(raster,0);
  }
  if (local_50 != (Image *)0x0) {
    Image::destroy(local_50);
  }
  return 1;
}

Assistant:

bool32
rasterFromImage(Raster *raster, Image *image)
{
	if((raster->type&0xF) != Raster::TEXTURE)
		return 0;

	void (*conv)(uint8 *out, uint8 *in) = nil;

	// Unpalettize image if necessary but don't change original
	Image *truecolimg = nil;
	if(image->depth <= 8){
		truecolimg = Image::create(image->width, image->height, image->depth);
		truecolimg->pixels = image->pixels;
		truecolimg->stride = image->stride;
		truecolimg->palette = image->palette;
		truecolimg->unpalettize();
		image = truecolimg;
	}

	Gl3Raster *natras = GETGL3RASTEREXT(raster);
	int32 format = raster->format&0xF00;
	assert(!natras->isCompressed);
	switch(image->depth){
	case 32:
		if(gl3Caps.gles)
			conv = conv_RGBA8888_from_RGBA8888;
		else if(format == Raster::C8888)
			conv = conv_RGBA8888_from_RGBA8888;
		else if(format == Raster::C888)
			conv = conv_RGB888_from_RGB888;
		else
			goto err;
		break;
	case 24:
		if(gl3Caps.gles)
			conv = conv_RGBA8888_from_RGB888;
		else if(format == Raster::C8888)
			conv = conv_RGBA8888_from_RGB888;
		else if(format == Raster::C888)
			conv = conv_RGB888_from_RGB888;
		else
			goto err;
		break;
	case 16:
		if(gl3Caps.gles)
			conv = conv_RGBA8888_from_ARGB1555;
		else if(format == Raster::C1555)
			conv = conv_RGBA5551_from_ARGB1555;
		else
			goto err;
		break;

	case 8:
	case 4:
	default:
	err:
		RWERROR((ERR_INVRASTER));
		return 0;
	}

	natras->hasAlpha = image->hasAlpha();

	bool unlock = false;
	if(raster->pixels == nil){
		raster->lock(0, Raster::LOCKWRITE|Raster::LOCKNOFETCH);
		unlock = true;
	}

	uint8 *pixels = raster->pixels;
	assert(pixels);
	uint8 *imgpixels = image->pixels + (image->height-1)*image->stride;

	int x, y;
	assert(image->width == raster->width);
	assert(image->height == raster->height);
	for(y = 0; y < image->height; y++){
		uint8 *imgrow = imgpixels;
		uint8 *rasrow = pixels;
		for(x = 0; x < image->width; x++){
			conv(rasrow, imgrow);
			imgrow += image->bpp;
			rasrow += natras->bpp;
		}
		imgpixels -= image->stride;
		pixels += raster->stride;
	}
	if(unlock)
		raster->unlock(0);

	if(truecolimg)
		truecolimg->destroy();

	return 1;
}